

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong uVar5;
  BPMNode *pBVar6;
  BPMNode *pBVar7;
  BPMNode *pBVar8;
  ulong uVar9;
  undefined4 uVar10;
  BPMNode *leaves;
  ulong uVar11;
  BPMNode *pBVar12;
  ulong uVar13;
  BPMNode **ppBVar14;
  BPMNode **ppBVar15;
  uint uVar16;
  uint uVar17;
  BPMNode *pBVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong numpresent;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  BPMLists lists;
  BPMLists local_78;
  size_t local_40;
  ulong local_38;
  
  auVar28 = in_ZMM3._0_32_;
  uVar17 = 0x50;
  if ((uint)numcodes <= (uint)(1 << ((byte)maxbitlen & 0x1f)) && numcodes != 0) {
    leaves = (BPMNode *)malloc(numcodes * 0x18);
    if (leaves == (BPMNode *)0x0) {
      uVar17 = 0x53;
    }
    else {
      uVar11 = 0;
      numpresent = 0;
      do {
        if (frequencies[uVar11] != 0) {
          leaves[numpresent].weight = frequencies[uVar11];
          leaves[numpresent].index = (uint)uVar11;
          numpresent = numpresent + 1;
        }
        uVar11 = uVar11 + 1;
      } while ((uVar11 & 0xffffffff) != numcodes);
      uVar17 = 0;
      memset(lengths,0,numcodes << 2);
      if (numpresent == 1) {
        uVar16 = leaves->index;
        lengths[uVar16] = 1;
        lengths[(ulong)uVar16 == 0] = 1;
      }
      else if (numpresent == 0) {
        lengths[0] = 1;
        lengths[1] = 1;
        uVar17 = 0;
      }
      else {
        local_40 = numpresent * 0x18;
        pBVar12 = (BPMNode *)malloc(local_40);
        uVar11 = 1;
        uVar21 = 0;
        do {
          local_38 = uVar21;
          pBVar18 = leaves;
          pBVar7 = pBVar12;
          if ((local_38 & 1) == 0) {
            pBVar18 = pBVar12;
            pBVar7 = leaves;
          }
          uVar5 = uVar11 * 2;
          uVar21 = 0;
          do {
            uVar13 = uVar21 + uVar11;
            if (numpresent <= uVar21 + uVar11) {
              uVar13 = numpresent;
            }
            uVar20 = uVar21 + uVar5;
            uVar23 = uVar13;
            pBVar8 = pBVar18;
            uVar9 = uVar21;
            uVar25 = numpresent;
            if (uVar20 < numpresent) {
              uVar25 = uVar20;
            }
            for (; uVar21 < uVar25; uVar21 = uVar21 + 1) {
              if ((uVar9 < uVar13) &&
                 ((uVar25 <= uVar23 || (pBVar7[uVar9].weight <= pBVar7[uVar23].weight)))) {
                uVar24 = uVar9 + 1;
                uVar22 = uVar9;
              }
              else {
                uVar22 = uVar23;
                uVar23 = uVar23 + 1;
                uVar24 = uVar9;
              }
              uVar10 = *(undefined4 *)&pBVar7[uVar22].field_0x14;
              pBVar8->in_use = pBVar7[uVar22].in_use;
              *(undefined4 *)&pBVar8->field_0x14 = uVar10;
              pBVar1 = pBVar7 + uVar22;
              uVar17 = pBVar1->index;
              pBVar6 = pBVar1->tail;
              pBVar8->weight = pBVar1->weight;
              pBVar8->index = uVar17;
              pBVar8->tail = pBVar6;
              pBVar8 = pBVar8 + 1;
              uVar9 = uVar24;
            }
            pBVar18 = pBVar18 + uVar11 * 2;
            uVar21 = uVar20;
          } while (uVar20 < numpresent);
          uVar11 = uVar5;
          uVar21 = local_38 + 1;
        } while (uVar5 < numpresent);
        if (local_40 != 0 && (local_38 & 1) == 0) {
          memcpy(leaves,pBVar12,local_40);
        }
        free(pBVar12);
        local_78.memsize = (maxbitlen + 1) * maxbitlen * 2;
        uVar11 = (ulong)local_78.memsize;
        local_78.nextfree = 0;
        local_78.numfree = local_78.memsize;
        local_78.listsize = maxbitlen;
        pBVar12 = (BPMNode *)malloc(uVar11 * 0x18);
        local_78.memory = pBVar12;
        ppBVar14 = (BPMNode **)malloc(uVar11 * 8);
        local_78.freelist = ppBVar14;
        ppBVar15 = (BPMNode **)malloc((ulong)maxbitlen << 3);
        local_78.chains0 = ppBVar15;
        local_78.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
        uVar17 = 0x53;
        if (((ppBVar15 != (BPMNode **)0x0 && ppBVar14 != (BPMNode **)0x0) &&
            pBVar12 != (BPMNode *)0x0) && local_78.chains1 != (BPMNode **)0x0) {
          uVar17 = 0;
        }
        if (((ppBVar15 != (BPMNode **)0x0 && ppBVar14 != (BPMNode **)0x0) &&
            pBVar12 != (BPMNode *)0x0) && local_78.chains1 != (BPMNode **)0x0) {
          if (uVar11 != 0) {
            lVar19 = uVar11 - 1;
            auVar27._8_8_ = lVar19;
            auVar27._0_8_ = lVar19;
            auVar27._16_8_ = lVar19;
            auVar27._24_8_ = lVar19;
            auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            uVar21 = 0;
            auVar26._8_8_ = 0x8000000000000000;
            auVar26._0_8_ = 0x8000000000000000;
            auVar26._16_8_ = 0x8000000000000000;
            auVar26._24_8_ = 0x8000000000000000;
            auVar28 = vpcmpeqd_avx2(auVar28,auVar28);
            auVar29._8_8_ = 0x18;
            auVar29._0_8_ = 0x18;
            auVar29._16_8_ = 0x18;
            auVar29._24_8_ = 0x18;
            auVar30._8_8_ = pBVar12;
            auVar30._0_8_ = pBVar12;
            auVar30._16_8_ = pBVar12;
            auVar30._24_8_ = pBVar12;
            auVar31._8_8_ = 4;
            auVar31._0_8_ = 4;
            auVar31._16_8_ = 4;
            auVar31._24_8_ = 4;
            do {
              auVar2 = vpcmpgtq_avx2(auVar3 ^ auVar26,auVar27 ^ auVar26);
              auVar4 = vpmuludq_avx2(auVar3,auVar29);
              auVar4 = vpaddq_avx2(auVar4,auVar30);
              auVar32 = vpsrlq_avx2(auVar3,0x20);
              auVar32 = vpmuludq_avx2(auVar32,auVar29);
              auVar32 = vpsllq_avx2(auVar32,0x20);
              auVar4 = vpaddq_avx2(auVar4,auVar32);
              auVar4 = vpmaskmovq_avx2(auVar2 ^ auVar28,auVar4);
              *(undefined1 (*) [32])(ppBVar14 + uVar21) = auVar4;
              uVar21 = uVar21 + 4;
              auVar3 = vpaddq_avx2(auVar3,auVar31);
            } while ((uVar11 + 3 & 0xfffffffffffffffc) != uVar21);
          }
          bpmnode_create(&local_78,leaves->weight,1,(BPMNode *)0x0);
          bpmnode_create(&local_78,leaves[1].weight,2,(BPMNode *)0x0);
          if ((ulong)local_78.listsize != 0) {
            uVar11 = 0;
            do {
              local_78.chains0[uVar11] = local_78.memory;
              local_78.chains1[uVar11] = local_78.memory + 1;
              uVar11 = uVar11 + 1;
            } while (local_78.listsize != uVar11);
          }
          uVar11 = numpresent * 2 - 2;
          if (uVar11 != 2) {
            uVar21 = 2;
            do {
              boundaryPM(&local_78,leaves,numpresent,maxbitlen - 1,(int)uVar21);
              uVar21 = (ulong)((int)uVar21 + 1);
            } while (uVar11 != uVar21);
          }
          for (pBVar12 = local_78.chains1[maxbitlen - 1]; pBVar12 != (BPMNode *)0x0;
              pBVar12 = pBVar12->tail) {
            if (pBVar12->index != 0) {
              uVar11 = 0;
              do {
                lengths[leaves[uVar11].index] = lengths[leaves[uVar11].index] + 1;
                uVar16 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar16;
              } while (uVar16 != pBVar12->index);
            }
          }
        }
        ppBVar14 = local_78.chains1;
        free(local_78.memory);
        free(local_78.freelist);
        free(local_78.chains0);
        free(ppBVar14);
      }
      free(leaves);
    }
  }
  return uVar17;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
  size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if (numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if ((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if (!leaves) return 83; /*alloc fail*/

  for (i = 0; i != numcodes; ++i) {
    if (frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  lodepng_memset(lengths, 0, numcodes * sizeof(*lengths));

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoretical 0 bits but in practice zlib wants 1 bit*/
  if (numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if (numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if (!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if (!error) {
      for (i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for (i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for (i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for (node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for (i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}